

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeCursorMoveto(VdbeCursor **pp,int *piCol)

{
  VdbeCursor *p_00;
  int iVar1;
  int iMap;
  VdbeCursor *p;
  int *piCol_local;
  VdbeCursor **pp_local;
  
  p_00 = *pp;
  if (p_00->deferredMoveto == '\0') {
    iVar1 = sqlite3BtreeCursorHasMoved((p_00->uc).pCursor);
    if (iVar1 == 0) {
      pp_local._4_4_ = 0;
    }
    else {
      pp_local._4_4_ = handleMovedCursor(p_00);
    }
  }
  else if ((p_00->aAltMap == (int *)0x0) || (iVar1 = p_00->aAltMap[*piCol + 1], iVar1 < 1)) {
    pp_local._4_4_ = handleDeferredMoveto(p_00);
  }
  else {
    *pp = p_00->pAltCursor;
    *piCol = iVar1 + -1;
    pp_local._4_4_ = 0;
  }
  return pp_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCursorMoveto(VdbeCursor **pp, int *piCol){
  VdbeCursor *p = *pp;
  assert( p->eCurType==CURTYPE_BTREE || p->eCurType==CURTYPE_PSEUDO );
  if( p->deferredMoveto ){
    int iMap;
    if( p->aAltMap && (iMap = p->aAltMap[1+*piCol])>0 ){
      *pp = p->pAltCursor;
      *piCol = iMap - 1;
      return SQLITE_OK;
    }
    return handleDeferredMoveto(p);
  }
  if( sqlite3BtreeCursorHasMoved(p->uc.pCursor) ){
    return handleMovedCursor(p);
  }
  return SQLITE_OK;
}